

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginMenu(char *label,bool enabled)

{
  int iVar1;
  ImGuiWindow *this;
  ImGuiPopupRef *pIVar2;
  ImGuiWindow *this_00;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ImGuiID id;
  bool bVar8;
  undefined7 in_register_00000031;
  byte bVar9;
  float fVar10;
  float fVar11;
  ImVec2 IVar12;
  ImVec2 IVar13;
  ImVec2 IVar14;
  undefined8 extraout_XMM0_Qb;
  float fVar15;
  float fVar16;
  ImRect IVar17;
  ImVec2 ta;
  ImVec2 local_94;
  undefined4 local_8c;
  undefined1 local_88 [16];
  ImGuiWindow *local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ImGuiWindow **local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems != false) {
    return false;
  }
  id = ImGuiWindow::GetID(this,label,(char *)0x0);
  IVar12 = CalcTextSize(label,(char *)0x0,true,-1.0);
  local_88._8_8_ = extraout_XMM0_Qb;
  local_88._0_4_ = IVar12.x;
  local_88._4_4_ = IVar12.y;
  bVar4 = IsPopupOpen(id);
  if (((this->Flags & 0x4000000) == 0) &&
     (iVar1 = (pIVar3->BeginPopupStack).Size, iVar1 < (pIVar3->OpenPopupStack).Size)) {
    local_70 = pIVar3->NavWindow;
    if ((pIVar3->OpenPopupStack).Data[iVar1].OpenParentId !=
        (this->IDStack).Data[(long)(this->IDStack).Size + -1]) goto LAB_00145f50;
    pIVar3->NavWindow = this;
    bVar9 = 1;
  }
  else {
    local_70 = pIVar3->NavWindow;
LAB_00145f50:
    bVar9 = 0;
  }
  local_48 = &pIVar3->NavWindow;
  local_94.x = (this->DC).CursorPos.x;
  local_94.y = (this->DC).CursorPos.y;
  local_58 = ZEXT416((uint)local_94.x);
  local_8c = (undefined4)CONCAT71(in_register_00000031,enabled);
  if ((this->DC).LayoutType == 0) {
    local_58 = ZEXT416((uint)((local_94.x + -1.0) -
                             (float)(int)((pIVar3->Style).ItemSpacing.x * 0.5)));
    local_68 = ZEXT416((uint)(local_94.y - (pIVar3->Style).FramePadding.y));
    local_94.y = ImGuiWindow::MenuBarHeight(this);
    local_94.y = local_94.y + (float)local_68._0_4_;
    local_94.x = (float)local_58._0_4_;
    (this->DC).CursorPos.x =
         (float)(int)((pIVar3->Style).ItemSpacing.x * 0.5) + (this->DC).CursorPos.x;
    IVar12 = (pIVar3->Style).ItemSpacing;
    fVar11 = IVar12.x;
    fVar10 = IVar12.y;
    ta.x = fVar11 + fVar11;
    ta.y = fVar10 + fVar10;
    PushStyleVar(0xd,&ta);
    ta.y = 0.0;
    ta.x = (float)local_88._0_4_;
    bVar5 = Selectable(label,bVar4,(uint)!enabled * 8 + 0xc01,&ta);
    PopStyleVar(1);
    (this->DC).CursorPos.x =
         (float)(int)((pIVar3->Style).ItemSpacing.x * -0.5) + (this->DC).CursorPos.x;
    if (enabled) goto LAB_00146196;
    bVar6 = false;
  }
  else {
    local_68 = ZEXT416((uint)local_94.y);
    local_94.y = local_94.y - (pIVar3->Style).WindowPadding.y;
    fVar10 = ImGuiMenuColumns::DeclColumns
                       (&this->MenuColumns,(float)local_88._0_4_,0.0,
                        (float)(int)(pIVar3->FontSize * 1.2));
    IVar12 = GetContentRegionAvail();
    fVar11 = IVar12.x - fVar10;
    local_88 = ZEXT416(~-(uint)(fVar11 <= 0.0) & (uint)fVar11);
    ta.y = 0.0;
    ta.x = fVar10;
    bVar5 = Selectable(label,bVar4,(uint)!enabled * 8 + 0x2c01,&ta);
    if (enabled) {
      IVar13.x = (float)local_58._0_4_ +
                 pIVar3->FontSize * 0.3 + (float)local_88._0_4_ + (this->MenuColumns).Pos[2];
      IVar13.y = (float)local_68._0_4_ + 0.0;
      RenderArrow(IVar13,1,1.0);
LAB_00146196:
      bVar6 = ItemHoverable(&(this->DC).LastItemRect,id);
    }
    else {
      bVar6 = false;
      PushStyleColor(0,(pIVar3->Style).Colors + 1);
      IVar12.x = (float)local_58._0_4_ +
                 pIVar3->FontSize * 0.3 + (float)local_88._0_4_ + (this->MenuColumns).Pos[2];
      IVar12.y = (float)local_68._0_4_ + 0.0;
      RenderArrow(IVar12,1,1.0);
      PopStyleColor(1);
    }
  }
  if (bVar9 != 0) {
    *local_48 = local_70;
  }
  if ((this->DC).LayoutType == 1) {
    if ((((pIVar3->HoveredWindow == this) &&
         (iVar1 = (pIVar3->BeginPopupStack).Size, iVar1 < (pIVar3->OpenPopupStack).Size)) &&
        (pIVar2 = (pIVar3->OpenPopupStack).Data, pIVar2[iVar1].ParentWindow == this)) &&
       (((this->Flags & 0x400) == 0 &&
        (this_00 = pIVar2[iVar1].Window, this_00 != (ImGuiWindow *)0x0)))) {
      IVar17 = ImGuiWindow::Rect(this_00);
      local_40.x = IVar17.Max.x;
      IVar12 = (pIVar3->IO).MousePos;
      IVar13 = (pIVar3->IO).MouseDelta;
      fVar11 = IVar12.x - IVar13.x;
      ta.y = IVar12.y - IVar13.y;
      fVar10 = (this_00->Pos).x;
      IVar14.y = IVar17.Min.y;
      if (fVar10 < (this->Pos).x || fVar10 == (this->Pos).x) {
        IVar14.x = local_40.x;
        fVar10 = 0.5;
      }
      else {
        fVar10 = -0.5;
        local_40.x = IVar17.Min.x;
        IVar14 = IVar17.Min;
      }
      fVar15 = ABS(fVar11 - IVar14.x) * 0.3;
      fVar16 = 30.0;
      if (fVar15 <= 30.0) {
        fVar16 = fVar15;
      }
      fVar16 = (float)(-(uint)(fVar15 < 5.0) & 0x40a00000 | ~-(uint)(fVar15 < 5.0) & (uint)fVar16);
      ta.x = fVar10 + fVar11;
      fVar10 = (IVar14.y - fVar16) - ta.y;
      if (fVar10 <= -100.0) {
        fVar10 = -100.0;
      }
      local_38.y = fVar10 + ta.y;
      local_38.x = IVar14.x;
      fVar10 = (IVar17.Max.y + fVar16) - ta.y;
      if (100.0 <= fVar10) {
        fVar10 = 100.0;
      }
      local_40.y = fVar10 + ta.y;
      bVar7 = ImTriangleContainsPoint(&ta,&local_38,&local_40,&(pIVar3->IO).MousePos);
    }
    else {
      bVar7 = false;
    }
    if ((bVar6 != false || !bVar4) || (pIVar3->HoveredWindow != this)) {
      bVar8 = false;
    }
    else {
      bVar8 = (bool)((bVar7 ^ 1U) & pIVar3->HoveredIdPreviousFrame != 0 &
                    pIVar3->HoveredIdPreviousFrame != id);
    }
    bVar7 = (bool)((bVar6 ^ 1U | bVar7 | bVar4) ^ 1);
    if (!bVar4) {
      bVar7 = (bool)(bVar5 & bVar6 | bVar7);
    }
    if (pIVar3->NavActivateId == id) {
      bVar8 = bVar4;
      bVar7 = !bVar4;
    }
    if (((pIVar3->NavId != id) || (pIVar3->NavMoveRequest != true)) || (pIVar3->NavMoveDir != 1))
    goto LAB_001463d4;
LAB_0014635f:
    NavMoveRequestCancel();
    bVar7 = true;
  }
  else {
    if (bVar5 != false) {
      bVar8 = (bool)(bVar9 & bVar5 & bVar4);
      bVar4 = (bool)(bVar4 ^ bVar8);
      bVar7 = (bool)(bVar8 ^ 1);
      goto LAB_001463d4;
    }
    if ((byte)(bVar4 | bVar9 & bVar6 ^ 1) == 1) {
      if ((pIVar3->NavId == id) && (pIVar3->NavMoveRequest == true)) {
        bVar8 = false;
        if (pIVar3->NavMoveDir != 3) {
          bVar7 = false;
          goto LAB_001463d4;
        }
        goto LAB_0014635f;
      }
      bVar7 = false;
    }
    else {
      bVar7 = true;
      bVar4 = false;
    }
    bVar8 = false;
  }
LAB_001463d4:
  if ((((char)local_8c == '\0') || (bVar8 != false)) && (bVar5 = IsPopupOpen(id), bVar5)) {
    ClosePopupToLevel((pIVar3->BeginPopupStack).Size,true);
  }
  if (((~bVar7 & 1U) == 0 && bVar4 == false) &&
     ((pIVar3->BeginPopupStack).Size < (pIVar3->OpenPopupStack).Size)) {
    OpenPopup(label);
    return false;
  }
  if (bVar7 == false) {
    if (bVar4 == false) {
      return false;
    }
  }
  else {
    OpenPopup(label);
  }
  ta.x = 0.0;
  ta.y = 0.0;
  SetNextWindowPos(&local_94,1,&ta);
  bVar4 = BeginPopupEx(id,(uint)((this->Flags & 0x14000000U) != 0) << 0x18 | 0x10080145);
  return bVar4;
}

Assistant:

bool ImGui::BeginMenu(const char* label, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    ImVec2 label_size = CalcTextSize(label, NULL, true);

    bool pressed;
    bool menu_is_open = IsPopupOpen(id);
    bool menuset_is_open = !(window->Flags & ImGuiWindowFlags_Popup) && (g.OpenPopupStack.Size > g.BeginPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].OpenParentId == window->IDStack.back());
    ImGuiWindow* backed_nav_window = g.NavWindow;
    if (menuset_is_open)
        g.NavWindow = window;  // Odd hack to allow hovering across menus of a same menu-set (otherwise we wouldn't be able to hover parent)

    // The reference position stored in popup_pos will be used by Begin() to find a suitable position for the child menu (using FindBestWindowPosForPopup).
    ImVec2 popup_pos, pos = window->DC.CursorPos;
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
    {
        // Menu inside an horizontal menu bar
        // Selectable extend their highlight by half ItemSpacing in each direction.
        // For ChildMenu, the popup position will be overwritten by the call to FindBestWindowPosForPopup() in Begin()
        popup_pos = ImVec2(pos.x - 1.0f - (float)(int)(style.ItemSpacing.x * 0.5f), pos.y - style.FramePadding.y + window->MenuBarHeight());
        window->DC.CursorPos.x += (float)(int)(style.ItemSpacing.x * 0.5f);
        PushStyleVar(ImGuiStyleVar_ItemSpacing, style.ItemSpacing * 2.0f);
        float w = label_size.x;
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_NoHoldingActiveID | ImGuiSelectableFlags_PressedOnClick | ImGuiSelectableFlags_DontClosePopups | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(w, 0.0f));
        PopStyleVar();
        window->DC.CursorPos.x += (float)(int)(style.ItemSpacing.x * (-1.0f + 0.5f)); // -1 spacing to compensate the spacing added when Selectable() did a SameLine(). It would also work to call SameLine() ourselves after the PopStyleVar().
    }
    else
    {
        // Menu inside a menu
        popup_pos = ImVec2(pos.x, pos.y - style.WindowPadding.y);
        float w = window->MenuColumns.DeclColumns(label_size.x, 0.0f, (float)(int)(g.FontSize * 1.20f)); // Feedback to next frame
        float extra_w = ImMax(0.0f, GetContentRegionAvail().x - w);
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_NoHoldingActiveID | ImGuiSelectableFlags_PressedOnClick | ImGuiSelectableFlags_DontClosePopups | ImGuiSelectableFlags_DrawFillAvailWidth | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(w, 0.0f));
        if (!enabled) PushStyleColor(ImGuiCol_Text, g.Style.Colors[ImGuiCol_TextDisabled]);
        RenderArrow(pos + ImVec2(window->MenuColumns.Pos[2] + extra_w + g.FontSize * 0.30f, 0.0f), ImGuiDir_Right);
        if (!enabled) PopStyleColor();
    }

    const bool hovered = enabled && ItemHoverable(window->DC.LastItemRect, id);
    if (menuset_is_open)
        g.NavWindow = backed_nav_window;

    bool want_open = false, want_close = false;
    if (window->DC.LayoutType == ImGuiLayoutType_Vertical) // (window->Flags & (ImGuiWindowFlags_Popup|ImGuiWindowFlags_ChildMenu))
    {
        // Implement http://bjk5.com/post/44698559168/breaking-down-amazons-mega-dropdown to avoid using timers, so menus feels more reactive.
        bool moving_within_opened_triangle = false;
        if (g.HoveredWindow == window && g.OpenPopupStack.Size > g.BeginPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].ParentWindow == window && !(window->Flags & ImGuiWindowFlags_MenuBar))
        {
            if (ImGuiWindow* next_window = g.OpenPopupStack[g.BeginPopupStack.Size].Window)
            {
                ImRect next_window_rect = next_window->Rect();
                ImVec2 ta = g.IO.MousePos - g.IO.MouseDelta;
                ImVec2 tb = (window->Pos.x < next_window->Pos.x) ? next_window_rect.GetTL() : next_window_rect.GetTR();
                ImVec2 tc = (window->Pos.x < next_window->Pos.x) ? next_window_rect.GetBL() : next_window_rect.GetBR();
                float extra = ImClamp(ImFabs(ta.x - tb.x) * 0.30f, 5.0f, 30.0f); // add a bit of extra slack.
                ta.x += (window->Pos.x < next_window->Pos.x) ? -0.5f : +0.5f;   // to avoid numerical issues
                tb.y = ta.y + ImMax((tb.y - extra) - ta.y, -100.0f);            // triangle is maximum 200 high to limit the slope and the bias toward large sub-menus // FIXME: Multiply by fb_scale?
                tc.y = ta.y + ImMin((tc.y + extra) - ta.y, +100.0f);
                moving_within_opened_triangle = ImTriangleContainsPoint(ta, tb, tc, g.IO.MousePos);
                //window->DrawList->PushClipRectFullScreen(); window->DrawList->AddTriangleFilled(ta, tb, tc, moving_within_opened_triangle ? IM_COL32(0,128,0,128) : IM_COL32(128,0,0,128)); window->DrawList->PopClipRect(); // Debug
            }
        }

        want_close = (menu_is_open && !hovered && g.HoveredWindow == window && g.HoveredIdPreviousFrame != 0 && g.HoveredIdPreviousFrame != id && !moving_within_opened_triangle);
        want_open = (!menu_is_open && hovered && !moving_within_opened_triangle) || (!menu_is_open && hovered && pressed);

        if (g.NavActivateId == id)
        {
            want_close = menu_is_open;
            want_open = !menu_is_open;
        }
        if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Right) // Nav-Right to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }
    else
    {
        // Menu bar
        if (menu_is_open && pressed && menuset_is_open) // Click an open menu again to close it
        {
            want_close = true;
            want_open = menu_is_open = false;
        }
        else if (pressed || (hovered && menuset_is_open && !menu_is_open)) // First click to open, then hover to open others
        {
            want_open = true;
        }
        else if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Down) // Nav-Down to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }

    if (!enabled) // explicitly close if an open menu becomes disabled, facilitate users code a lot in pattern such as 'if (BeginMenu("options", has_object)) { ..use object.. }'
        want_close = true;
    if (want_close && IsPopupOpen(id))
        ClosePopupToLevel(g.BeginPopupStack.Size, true);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags | ImGuiItemStatusFlags_Openable | (menu_is_open ? ImGuiItemStatusFlags_Opened : 0));

    if (!menu_is_open && want_open && g.OpenPopupStack.Size > g.BeginPopupStack.Size)
    {
        // Don't recycle same menu level in the same frame, first close the other menu and yield for a frame.
        OpenPopup(label);
        return false;
    }

    menu_is_open |= want_open;
    if (want_open)
        OpenPopup(label);

    if (menu_is_open)
    {
        // Sub-menus are ChildWindow so that mouse can be hovering across them (otherwise top-most popup menu would steal focus and not allow hovering on parent menu)
        SetNextWindowPos(popup_pos, ImGuiCond_Always);
        ImGuiWindowFlags flags = ImGuiWindowFlags_ChildMenu | ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoNavFocus;
        if (window->Flags & (ImGuiWindowFlags_Popup|ImGuiWindowFlags_ChildMenu))
            flags |= ImGuiWindowFlags_ChildWindow;
        menu_is_open = BeginPopupEx(id, flags); // menu_is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    }

    return menu_is_open;
}